

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O2

bool Rml::BuildToken(String *token,char **token_begin,char *string_end,bool first_token,
                    bool collapse_white_space,bool break_at_endline,
                    TextTransform text_transformation,bool decode_escape_characters)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  char cVar6;
  byte bVar7;
  String escape_code;
  
  if ((*token_begin == string_end) &&
     (bVar2 = Assert("RMLUI_ASSERT(token_begin != string_end)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0x1fd), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::__cxx11::string::reserve((ulong)token);
  pbVar5 = (byte *)*token_begin;
  if ((0x20 < (ulong)*pbVar5) || (bVar2 = true, (0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
  {
    bVar2 = false;
  }
  do {
    if (pbVar5 == (byte *)string_end) {
      return false;
    }
    bVar7 = *pbVar5;
    cVar6 = (char)token;
    pbVar4 = pbVar5;
    if (bVar7 == 0x26 && decode_escape_characters) {
      while (pbVar4 != (byte *)string_end) {
        if (*pbVar4 == 0x3b) {
          escape_code._M_dataplus._M_p = (pointer)&escape_code.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&escape_code,pbVar5 + 1);
          bVar3 = ::std::operator==(&escape_code,"lt");
          if (bVar3) {
            bVar7 = 0x3c;
LAB_00297671:
            bVar3 = false;
          }
          else {
            bVar3 = ::std::operator==(&escape_code,"gt");
            if (bVar3) {
              bVar7 = 0x3e;
              goto LAB_00297671;
            }
            bVar3 = ::std::operator==(&escape_code,"amp");
            bVar7 = 0x26;
            if (bVar3) goto LAB_00297671;
            bVar3 = ::std::operator==(&escape_code,"quot");
            if (bVar3) {
              bVar7 = 0x22;
              goto LAB_00297671;
            }
            bVar3 = ::std::operator==(&escape_code,"nbsp");
            if (!bVar3) {
              *token_begin = (char *)pbVar5;
              goto LAB_00297671;
            }
            bVar3 = true;
            bVar7 = 0x20;
          }
          ::std::__cxx11::string::~string((string *)&escape_code);
          if (!bVar3) goto LAB_00297686;
          goto LAB_002976b5;
        }
        *token_begin = (char *)(pbVar4 + 1);
        pbVar4 = pbVar4 + 1;
      }
      *token_begin = (char *)pbVar5;
LAB_002976b5:
      if (bVar2) {
        if (!collapse_white_space) {
LAB_00297769:
          *token_begin = (char *)pbVar5;
          return false;
        }
        if (!first_token) {
          ::std::__cxx11::string::push_back(cVar6);
        }
        bVar2 = false;
      }
LAB_0029770e:
      ::std::__cxx11::string::push_back(cVar6);
    }
    else {
      if (bVar7 == 10 && break_at_endline) {
        ::std::__cxx11::string::push_back(cVar6);
        *token_begin = *token_begin + 1;
        return true;
      }
LAB_00297686:
      if ((0x20 < bVar7) || ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0)) goto LAB_002976b5;
      if (!bVar2) {
        if (collapse_white_space) {
          if (*token_begin == string_end) {
            return false;
          }
          bVar2 = LastToken(*token_begin,string_end,true,break_at_endline);
          if (!bVar2) {
            return false;
          }
          ::std::__cxx11::string::push_back(cVar6);
          return false;
        }
        goto LAB_00297769;
      }
      if (!collapse_white_space) goto LAB_0029770e;
    }
    pbVar5 = (byte *)(*token_begin + 1);
    *token_begin = (char *)pbVar5;
  } while( true );
}

Assistant:

static bool BuildToken(String& token, const char*& token_begin, const char* string_end, bool first_token, bool collapse_white_space,
	bool break_at_endline, Style::TextTransform text_transformation, bool decode_escape_characters)
{
	RMLUI_ASSERT(token_begin != string_end);

	token.reserve(string_end - token_begin + token.size());

	// Check what the first character of the token is; all we need to know is if it is white-space or not.
	bool parsing_white_space = StringUtilities::IsWhitespace(*token_begin);

	// Loop through the string from the token's beginning until we find an end to the token. This can occur in various
	// places, depending on the white-space processing;
	//  - at the end of a section of non-white-space characters,
	//  - at the end of a section of white-space characters, if we're not collapsing white-space,
	//  - at an endline token, if we're breaking on endlines.
	while (token_begin != string_end)
	{
		bool force_non_whitespace = false;
		char character = *token_begin;

		const char* escape_begin = token_begin;

		// Check for an ampersand; if we find one, we've got an HTML escaped character.
		if (decode_escape_characters && character == '&')
		{
			// Find the terminating ';'.
			while (token_begin != string_end && *token_begin != ';')
				++token_begin;

			// If we couldn't find the ';', print the token like normal text.
			if (token_begin == string_end)
			{
				token_begin = escape_begin;
			}
			// We could find a ';', parse the escape code. If the escape code is recognised, set the parsed character
			// to the appropriate one. If it is a non-breaking space, prevent it being picked up as whitespace. If it
			// is not recognised, print the token like normal text.
			else
			{
				String escape_code(escape_begin + 1, token_begin);

				if (escape_code == "lt")
					character = '<';
				else if (escape_code == "gt")
					character = '>';
				else if (escape_code == "amp")
					character = '&';
				else if (escape_code == "quot")
					character = '"';
				else if (escape_code == "nbsp")
				{
					character = ' ';
					force_non_whitespace = true;
				}
				else
					token_begin = escape_begin;
			}
		}

		// Check for an endline token; if we're breaking on endlines and we find one, then return true to indicate a
		// forced break.
		if (break_at_endline && character == '\n')
		{
			token += '\n';
			token_begin++;
			return true;
		}

		// If we've transitioned from white-space characters to non-white-space characters, or vice-versa, then check
		// if should terminate the token; if we're not collapsing white-space, then yes (as sections of white-space are
		// non-breaking), otherwise only if we've transitioned from characters to white-space.
		bool white_space = !force_non_whitespace && StringUtilities::IsWhitespace(character);
		if (white_space != parsing_white_space)
		{
			if (!collapse_white_space)
			{
				// Restore pointer to the beginning of the escaped token, if we processed an escape code.
				token_begin = escape_begin;
				return false;
			}

			// We're collapsing white-space; we only tokenise words, not white-space, so we're only done tokenising
			// once we've begun parsing non-white-space and then found white-space.
			if (!parsing_white_space)
			{
				// However, if we are the last non-whitespace character in the string, and there are trailing
				// whitespace characters after this token, then we need to append a single space to the end of this
				// token.
				if (token_begin != string_end && LastToken(token_begin, string_end, collapse_white_space, break_at_endline))
					token += ' ';

				return false;
			}

			// We've transitioned from white-space to non-white-space, so we append a single white-space character.
			if (!first_token)
				token += ' ';

			parsing_white_space = false;
		}

		// If the current character is white-space, we'll append a space character to the token if we're not collapsing
		// sections of white-space.
		if (white_space)
		{
			if (!collapse_white_space)
				token += ' ';
		}
		else
		{
			if (text_transformation == Style::TextTransform::Uppercase)
			{
				if (character >= 'a' && character <= 'z')
					character += ('A' - 'a');
			}
			else if (text_transformation == Style::TextTransform::Lowercase)
			{
				if (character >= 'A' && character <= 'Z')
					character -= ('A' - 'a');
			}

			token += character;
		}

		++token_begin;
	}

	return false;
}